

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads,
          bool autoAddType)

{
  int version_00;
  int iVar1;
  element_type *peVar2;
  InputPartData *in_RDI;
  byte in_R8B;
  int p;
  int pc;
  int version;
  string *in_stack_000000d8;
  Header *in_stack_000000e0;
  Context *in_stack_000000f0;
  Context *in_stack_00000110;
  ContextInitializer *in_stack_000002a8;
  char *in_stack_000002b0;
  Context *in_stack_000002b8;
  read_mode_t in_stack_000002c7;
  InputPartData *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  int iVar3;
  int iVar4;
  InputPartData *__new_size;
  _Base_ptr *this_00;
  int local_38;
  
  __new_size = in_RDI;
  Context::Context(in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002c7);
  this_00 = &(__new_size->header)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::make_shared<Imf_3_3::MultiPartInputFile::Data>();
  version_00 = Context::version(in_stack_000000f0);
  iVar4 = version_00;
  iVar1 = Context::partCount(in_stack_00000110);
  iVar3 = iVar1;
  std::
  __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x90b945);
  std::
  vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
  ::resize((vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
            *)this_00,(size_type)__new_size);
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    InputPartData::InputPartData
              (in_RDI,(Context *)CONCAT44(iVar4,iVar3),
               CONCAT13(in_stack_ffffffffffffff57,
                        CONCAT12(in_stack_ffffffffffffff56,in_stack_ffffffffffffff54)),
               in_stack_ffffffffffffff50);
    peVar2 = std::
             __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x90b9a7);
    std::
    vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
    ::operator[](&peVar2->parts,(long)local_38);
    InputPartData::operator=
              ((InputPartData *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,
                                 CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
               in_stack_ffffffffffffff48);
    InputPartData::~InputPartData
              ((InputPartData *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,
                                 CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))));
    if ((in_R8B & 1) != 0) {
      peVar2 = std::
               __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x90b9f0);
      std::
      vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
      ::operator[](&peVar2->parts,(long)local_38);
      in_stack_ffffffffffffff57 = Header::hasType((Header *)0x90ba0c);
      if (!(bool)in_stack_ffffffffffffff57) {
        in_stack_ffffffffffffff56 = isTiled(version_00);
        if ((bool)in_stack_ffffffffffffff56) {
          peVar2 = std::
                   __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x90ba4d);
          std::
          vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
          ::operator[](&peVar2->parts,(long)local_38);
          Header::setType(in_stack_000000e0,in_stack_000000d8);
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Imf_3_3::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x90bad4);
          std::
          vector<Imf_3_3::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_3::MultiPartInputFile::Data::Part>_>
          ::operator[](&peVar2->parts,(long)local_38);
          Header::setType(in_stack_000000e0,in_stack_000000d8);
        }
      }
    }
  }
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile (
        const char*               filename,
        const ContextInitializer& ctxtinit,
        int                       numThreads,
        bool                      autoAddType)
    : _ctxt (filename, ctxtinit, Context::read_mode_t{})
    , _data (std::make_shared<Data> ())
{
    int version = _ctxt.version ();
    int pc = _ctxt.partCount ();
    _data->parts.resize (pc);

    for ( int p = 0; p < pc; ++p )
    {
        _data->parts[p].data = InputPartData (_ctxt, p, numThreads);

        if (autoAddType && ! _data->parts[p].data.header.hasType ())
        {
            if (isTiled (version))
                _data->parts[p].data.header.setType (TILEDIMAGE);
            else
                _data->parts[p].data.header.setType (SCANLINEIMAGE);
        }
    }
}